

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::WriteDependerConnections
          (cmGraphVizWriter *this,string *targetName,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedConnections,cmGeneratedFileStream *str)

{
  _Link_type __k;
  _Base_ptr __n;
  bool bVar1;
  TargetType targetType;
  int iVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  iterator iVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  cmGlobalGenerator *globalGenerator;
  LinkLibraryScopeType *type;
  _Link_type __x;
  string myNodeName;
  string connectionName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  ll;
  cmGlobalGenerator *local_e8;
  long local_e0;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  long local_a8 [2];
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Base_ptr local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  local_60;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
          ::find(&(this->TargetPtrs)._M_t,targetName);
  local_d8._24_8_ = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
  if (cVar3._M_node != (_Base_ptr)local_d8._24_8_) {
    WriteNode(this,targetName,*(cmGeneratorTarget **)(cVar3._M_node + 2),insertedNodes,str);
    if (*(long *)(cVar3._M_node + 2) != 0) {
      local_70._8_8_ = &this->TargetNamesNodes;
      local_d8._16_8_ = insertedNodes;
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_70._8_8_,targetName);
      globalGenerator = (cmGlobalGenerator *)local_d8;
      local_e8 = globalGenerator;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,*(long *)(cVar4._M_node + 2),
                 (long)&(cVar4._M_node[2]._M_parent)->_M_color + *(long *)(cVar4._M_node + 2));
      p_Var8 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var8 != (_Base_ptr)local_d8._24_8_) {
        local_70._M_allocated_capacity =
             (size_type)&(this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header;
        local_78 = &(insertedConnections->_M_t)._M_impl.super__Rb_tree_header._M_header;
        do {
          if (*(cmGeneratorTarget **)(p_Var8 + 2) != (cmGeneratorTarget *)0x0) {
            targetType = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var8 + 2));
            bVar1 = GenerateForTargetType(this,targetType);
            if (bVar1) {
              __x = (_Link_type)**(undefined8 **)(p_Var8 + 2);
              (anonymous_namespace)::getScopedLinkLibrariesFromTarget_abi_cxx11_
                        (&local_60,(_anonymous_namespace_ *)__x,(cmTarget *)this->GlobalGenerator,
                         globalGenerator);
              if ((_Rb_tree_header *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                  != &local_60._M_t._M_impl.super__Rb_tree_header) {
                __k = (_Link_type)(p_Var8 + 1);
                p_Var7 = local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                do {
                  __n = p_Var7[1]._M_parent;
                  if (__n == (_Base_ptr)targetName->_M_string_length) {
                    if (__n == (_Base_ptr)0x0) {
                      bVar1 = true;
                    }
                    else {
                      __x = (_Link_type)(targetName->_M_dataplus)._M_p;
                      iVar2 = bcmp(*(void **)(p_Var7 + 1),__x,(size_t)__n);
                      bVar1 = iVar2 == 0;
                    }
                  }
                  else {
                    bVar1 = false;
                  }
                  if (bVar1) {
                    __x = __k;
                    cVar4 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_70._8_8_,(key_type *)__k);
                    if (cVar4._M_node != (_Base_ptr)local_70._M_allocated_capacity) {
                      local_b8._M_allocated_capacity = (size_type)(local_d8 + 0x30);
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)(local_d8 + 0x20),*(long *)(cVar4._M_node + 2),
                                 (long)&(cVar4._M_node[2]._M_parent)->_M_color +
                                 *(long *)(cVar4._M_node + 2));
                      std::__cxx11::string::append((char *)(local_d8 + 0x20));
                      std::__cxx11::string::_M_append(local_d8 + 0x20,(ulong)local_e8);
                      __x = (_Link_type)(local_d8 + 0x20);
                      iVar5 = std::
                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::find(&insertedConnections->_M_t,(key_type *)__x);
                      if (iVar5._M_node == local_78) {
                        std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)insertedConnections,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_d8 + 0x20));
                        WriteNode(this,(string *)__k,*(cmGeneratorTarget **)(p_Var8 + 2),
                                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_d8._16_8_,str);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)str,"    \"",5);
                        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)str,*(char **)(cVar4._M_node + 2),
                                            (long)cVar4._M_node[2]._M_parent);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" -> \"",6);
                        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar6,(char *)local_e8,local_e0);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)str," // ",4);
                        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)str,(targetName->_M_dataplus)._M_p,
                                            targetName->_M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ",4);
                        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar6,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent)
                        ;
                        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
                        std::ostream::put((char)poVar6);
                        std::ostream::flush();
                        (anonymous_namespace)::getLinkLibraryStyle_abi_cxx11_
                                  ((string *)local_98,(_anonymous_namespace_ *)(p_Var7 + 2),type);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)str,(char *)local_98._0_8_,local_98._8_8_);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_98._0_8_ != &local_88) {
                          operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
                        }
                        globalGenerator = (cmGlobalGenerator *)insertedConnections;
                        __x = __k;
                        WriteDependerConnections
                                  (this,(string *)__k,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_d8._16_8_,insertedConnections,str);
                      }
                      if ((undefined1 *)local_b8._M_allocated_capacity != local_d8 + 0x30) {
                        __x = (_Link_type)(local_a8[0] + 1);
                        operator_delete((void *)local_b8._M_allocated_capacity,(ulong)__x);
                      }
                    }
                    if (bVar1) break;
                  }
                  p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
                } while ((_Rb_tree_header *)p_Var7 != &local_60._M_t._M_impl.super__Rb_tree_header);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                          *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
            }
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != (_Base_ptr)local_d8._24_8_);
      }
      if (local_e8 != (cmGlobalGenerator *)local_d8) {
        operator_delete(local_e8,local_d8._0_8_ + 1);
      }
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteDependerConnections(
  const std::string& targetName, std::set<std::string>& insertedNodes,
  std::set<std::string>& insertedConnections, cmGeneratedFileStream& str) const
{
  std::map<std::string, const cmGeneratorTarget*>::const_iterator targetPtrIt =
    this->TargetPtrs.find(targetName);

  if (targetPtrIt == this->TargetPtrs.end()) // not found at all
  {
    return;
  }

  this->WriteNode(targetName, targetPtrIt->second, insertedNodes, str);

  if (targetPtrIt->second == nullptr) // it's an external library
  {
    return;
  }

  std::string myNodeName = this->TargetNamesNodes.find(targetName)->second;

  // now search who links against me
  for (auto const& tptr : this->TargetPtrs) {
    if (tptr.second == nullptr) {
      continue;
    }

    if (!this->GenerateForTargetType(tptr.second->GetType())) {
      continue;
    }

    // Now we have a target, check whether it links against targetName.
    // If so, draw a connection, and then continue with dependers on that one.
    std::map<std::string, LinkLibraryScopeType> ll =
      getScopedLinkLibrariesFromTarget(tptr.second->Target, GlobalGenerator);

    for (auto const& llit : ll) {
      if (llit.first == targetName) {
        // So this target links against targetName.
        std::map<std::string, std::string>::const_iterator dependerNodeNameIt =
          this->TargetNamesNodes.find(tptr.first);

        if (dependerNodeNameIt != this->TargetNamesNodes.end()) {
          std::string connectionName = dependerNodeNameIt->second;
          connectionName += "-";
          connectionName += myNodeName;

          if (insertedConnections.find(connectionName) ==
              insertedConnections.end()) {
            insertedConnections.insert(connectionName);
            this->WriteNode(tptr.first, tptr.second, insertedNodes, str);

            str << "    \"" << dependerNodeNameIt->second << "\" -> \""
                << myNodeName << "\"";
            str << " // " << targetName << " -> " << tptr.first << std::endl;
            str << getLinkLibraryStyle(llit.second);
            this->WriteDependerConnections(tptr.first, insertedNodes,
                                           insertedConnections, str);
          }
        }
        break;
      }
    }
  }
}